

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

int SDL_CDPlay(SDL12_CD *cdrom,int start,int length)

{
  int start_frame_00;
  SDL12_CD *cdrom_00;
  int local_3c;
  Uint32 local_38;
  int i;
  int nframes;
  int ntracks;
  int start_frame;
  int start_track;
  Uint32 remain;
  Uint32 ui32start;
  int length_local;
  int start_local;
  SDL12_CD *cdrom_local;
  
  ntracks = -1;
  i = -1;
  local_38 = 0xffffffff;
  cdrom_00 = ValidCDDevice(cdrom);
  if (cdrom_00 == (SDL12_CD *)0x0) {
    cdrom_local._4_4_ = -1;
  }
  else if (cdrom_00->status == SDL12_CD_TRAYEMPTY) {
    cdrom_local._4_4_ = (*SDL20_SetError)("Tray empty");
  }
  else if (start < 0) {
    cdrom_local._4_4_ = (*SDL20_SetError)("Invalid start");
  }
  else if (length < 0) {
    cdrom_local._4_4_ = (*SDL20_SetError)("Invalid length");
  }
  else {
    for (local_3c = 0; local_3c < cdrom_00->numtracks; local_3c = local_3c + 1) {
      if ((cdrom_00->track[local_3c].offset <= (uint)start) &&
         ((uint)start < cdrom_00->track[local_3c].offset + cdrom_00->track[local_3c].length)) {
        ntracks = local_3c;
        break;
      }
    }
    if (ntracks == -1) {
      cdrom_local._4_4_ = (*SDL20_SetError)("Invalid start");
    }
    else {
      start_frame_00 = start - cdrom_00->track[ntracks].offset;
      if ((uint)length < cdrom_00->track[ntracks].length - start_frame_00) {
        i = 0;
        start_frame = 0;
        local_38 = length;
      }
      else {
        start_frame = length - (cdrom_00->track[ntracks].length - start_frame_00);
        local_3c = ntracks;
        while (local_3c = local_3c + 1, local_3c < cdrom_00->numtracks) {
          if ((uint)start_frame < cdrom_00->track[local_3c].length) {
            i = local_3c - ntracks;
            local_38 = start_frame;
            start_frame = 0;
            break;
          }
          start_frame = start_frame - cdrom_00->track[local_3c].length;
        }
      }
      if (start_frame != 0) {
        i = (cdrom_00->numtracks - ntracks) + -1;
        local_38 = cdrom_00->track[cdrom_00->numtracks + -1].length;
      }
      cdrom_local._4_4_ = StartCDAudioPlaying(cdrom_00,ntracks,start_frame_00,i,local_38);
    }
  }
  return cdrom_local._4_4_;
}

Assistant:

SDLCALL
SDL_CDPlay(SDL12_CD *cdrom, int start, int length)
{
    const Uint32 ui32start = (Uint32) start;
    Uint32 remain = (Uint32) length;
    int start_track = -1;
    int start_frame = -1;
    int ntracks = -1;
    int nframes = -1;
    int i;

    if ((cdrom = ValidCDDevice(cdrom)) == NULL) {
        return -1;
    }
    if (cdrom->status == SDL12_CD_TRAYEMPTY) {
        return SDL20_SetError("Tray empty");
    }
    if (start < 0) {
        return SDL20_SetError("Invalid start");
    }
    if (length < 0) {
        return SDL20_SetError("Invalid length");
    }

    for (i = 0; i < cdrom->numtracks; i++) {
        if ((ui32start >= cdrom->track[i].offset) && (ui32start < (cdrom->track[i].offset + cdrom->track[i].length))) {
            start_track = i;
            break;
        }
    }

    if (start_track == -1) {
        return SDL20_SetError("Invalid start");
    }

    start_frame = start - cdrom->track[start_track].offset;

    if (remain < (cdrom->track[start_track].length - start_frame)) {
        ntracks = 0;
        nframes = remain;
        remain = 0;
    } else {
        remain -= (cdrom->track[start_track].length - start_frame);
        for (i = start_track + 1; i < cdrom->numtracks; i++) {
            if (remain < cdrom->track[i].length) {
                ntracks = i - start_track;
                nframes = remain;
                remain = 0;
                break;
            }
            remain -= cdrom->track[i].length;
        }
    }

    if (remain) {
        ntracks = (cdrom->numtracks - start_track) - 1;
        nframes = cdrom->track[cdrom->numtracks - 1].length;
    }

    return StartCDAudioPlaying(cdrom, start_track, start_frame, ntracks, nframes);
}